

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorPrevPage(lhash_kv_cursor *pPtr)

{
  int iVar1;
  lhpage *plStack_30;
  int rc;
  lhpage *pPage;
  lhash_bmap_rec *pRec;
  lhash_kv_cursor *pCur;
  lhash_kv_cursor *pPtr_local;
  
  pRec = (lhash_bmap_rec *)pPtr;
  pCur = pPtr;
  while( true ) {
    pPage = (lhpage *)pRec->pNextCol;
    if (pPage == (lhpage *)0x0) {
      *(undefined4 *)&pRec->iReal = 3;
      return -0x1c;
    }
    if ((pCur->iState == 2) && (pCur->pRaw != (unqlite_page *)0x0)) {
      (**(code **)(*(long *)pRec->iLogic + 0x50))(pCur->pRaw);
      pCur->pRaw = (unqlite_page *)0x0;
    }
    pRec->pNextCol = *(lhash_bmap_rec **)&pPage->sHdr;
    iVar1 = lhLoadPage((lhash_kv_engine *)pRec->iLogic,(pgno)pPage->pRaw,(lhpage *)0x0,
                       &stack0xffffffffffffffd0,0);
    if (iVar1 != 0) break;
    if (plStack_30->pFirst != (lhcell *)0x0) {
      pRec->pNext = (lhash_bmap_rec *)plStack_30->pFirst;
      *(undefined4 *)&pRec->iReal = 2;
      pRec->pPrev = (lhash_bmap_rec *)plStack_30->pRaw;
      return 0;
    }
    (*plStack_30->pHash->pIo->xPageUnref)(plStack_30->pRaw);
  }
  return iVar1;
}

Assistant:

static int lhCursorPrevPage(lhash_kv_cursor *pPtr)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pPtr;
	lhash_bmap_rec *pRec;
	lhpage *pPage;
	int rc;
	for(;;){
		pRec = pCur->pRec;
		if( pRec == 0 ){
			pCur->iState = L_HASH_CURSOR_STATE_DONE;
			return UNQLITE_DONE;
		}
		if( pPtr->iState == L_HASH_CURSOR_STATE_CELL && pPtr->pRaw ){
			/* Unref this page */
			pCur->pStore->pIo->xPageUnref(pPtr->pRaw);
			pPtr->pRaw = 0;
		}
		/* Advance the map cursor */
		pCur->pRec = pRec->pNext; /* Not a bug, reverse link */
		/* Load the previous page on the list */
		rc = lhLoadPage((lhash_kv_engine *)pCur->pStore,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pPage->pFirst ){
			/* Reflect the change */
			pCur->pCell = pPage->pFirst;
			pCur->iState = L_HASH_CURSOR_STATE_CELL;
			pCur->pRaw = pPage->pRaw;
			break;
		}
		/* Discard this page and continue */
		pPage->pHash->pIo->xPageUnref(pPage->pRaw);
	}
	return UNQLITE_OK;
}